

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  int iVar1;
  wchar_t *__dest;
  ulong uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  char_type buffer [26];
  undefined1 local_98 [104];
  
  iVar1 = *(int *)(this + 8);
  lVar12 = (long)iVar1;
  if (-1 < lVar12) {
    __dest = *it;
    uVar4 = *(ulong *)this;
    puVar3 = local_98 + lVar12 * 4;
    if (uVar4 < 100) {
      bVar13 = false;
    }
    else {
      iVar7 = -1;
      uVar9 = 1;
      iVar10 = -2;
      uVar11 = 2;
      uVar6 = uVar4;
      do {
        uVar4 = uVar6 / 100;
        uVar2 = (ulong)(uint)(((int)uVar6 + (int)uVar4 * -100) * 2);
        *(int *)(puVar3 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar2 + 1];
        lVar5 = -4;
        if ((int)(uVar9 / 3) * 3 + iVar7 == 0) {
          *(undefined4 *)(puVar3 + -8) = *(undefined4 *)(this + 0xc);
          lVar5 = -8;
        }
        *(int *)(puVar3 + lVar5 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar2];
        if ((uVar11 / 3) * 3 + iVar10 == 0) {
          *(undefined4 *)(puVar3 + lVar5 + -8) = *(undefined4 *)(this + 0xc);
          lVar5 = lVar5 + -8;
        }
        else {
          lVar5 = lVar5 + -4;
        }
        puVar3 = puVar3 + lVar5;
        iVar7 = iVar7 + -2;
        uVar8 = (int)uVar9 + 2;
        uVar9 = (ulong)uVar8;
        iVar10 = iVar10 + -2;
        uVar11 = uVar11 + 2;
        bVar13 = 9999 < uVar6;
        uVar6 = uVar4;
      } while (bVar13);
      bVar13 = iVar7 + (uVar8 / 3) * 3 == 0;
    }
    if (uVar4 < 10) {
      uVar11 = (uint)uVar4 | 0x30;
    }
    else {
      uVar4 = (uVar4 & 0xffffffff) * 2;
      *(int *)(puVar3 + -4) =
           (int)(char)internal::basic_data<void>::DIGITS[(uVar4 & 0xffffffff) + 1];
      lVar5 = -4;
      if (bVar13) {
        *(undefined4 *)(puVar3 + -8) = *(undefined4 *)(this + 0xc);
        lVar5 = -8;
      }
      puVar3 = puVar3 + lVar5;
      uVar11 = (uint)(char)internal::basic_data<void>::DIGITS[uVar4];
    }
    *(uint *)(puVar3 + -4) = uVar11;
    if (iVar1 != 0) {
      memcpy(__dest,local_98,lVar12 * 4);
    }
    *it = __dest + lVar12;
    return;
  }
  __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                ,0x3dd,
                "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = wchar_t, UInt = unsigned long, Iterator = wchar_t *, ThousandsSep = fmt::internal::add_thousands_sep<wchar_t>]"
               );
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }